

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparc.c
# Opt level: O3

int main(void)

{
  arm_cpsmode_type aVar1;
  arm_cpsflag_type aVar2;
  uint8_t *buffer;
  uchar *str;
  cs_detail *pcVar3;
  ulong uVar4;
  cs_err cVar5;
  size_t count;
  char *pcVar6;
  size_t len;
  size_t len_00;
  undefined8 unaff_R12;
  ulong uVar7;
  size_t sVar8;
  arm_cc *paVar9;
  long lVar10;
  cs_insn *insn;
  cs_insn *local_40;
  uint local_34;
  
  uVar7 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  lVar10 = 0;
  do {
    cVar5 = cs_open(CS_ARCH_SPARC,(&DAT_0025c4c4)[lVar10 * 8],&handle);
    if (cVar5 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_0025c4c8)[lVar10 * 4];
      str = (uchar *)(&DAT_0025c4d0)[lVar10 * 4];
      count = cs_disasm(handle,buffer,(size_t)str,0x1000,0,&local_40);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_0025c4d8)[lVar10 * 4]);
        print_string_hex((char *)buffer,str,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        local_34 = (uint)uVar7;
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_0025c4d8)[lVar10 * 4]);
        print_string_hex((char *)buffer,str,len);
        puts("Disasm:");
        sVar8 = 0;
        do {
          printf("0x%lx:\t%s\t%s\n",local_40[sVar8].address,local_40[sVar8].mnemonic,
                 local_40[sVar8].op_str);
          pcVar3 = local_40[sVar8].detail;
          if (pcVar3 != (cs_detail *)0x0) {
            if ((pcVar3->field_6).x86.rex != '\0') {
              printf("\top_count: %u\n");
              if ((pcVar3->field_6).x86.rex != '\0') {
                paVar9 = &(pcVar3->field_6).arm.cc;
                uVar7 = 0;
                do {
                  aVar1 = paVar9[-2];
                  if (aVar1 == ARM_CPSMODE_ID) {
                    printf("\t\toperands[%u].type: MEM\n",uVar7 & 0xffffffff);
                    if ((char)paVar9[-1] != ARM_CPSFLAG_INVALID) {
                      pcVar6 = cs_reg_name(handle,(uint)(byte)(char)paVar9[-1]);
                      printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar7 & 0xffffffff,pcVar6);
                    }
                    if (*(byte *)((long)paVar9 + -3) != 0) {
                      pcVar6 = cs_reg_name(handle,(uint)*(byte *)((long)paVar9 + -3));
                      printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar7 & 0xffffffff,pcVar6);
                    }
                    aVar2 = *paVar9;
                    if (aVar2 != ARM_CPSFLAG_INVALID) {
                      pcVar6 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
                      goto LAB_00143436;
                    }
                  }
                  else if (aVar1 == ARM_CPSMODE_IE) {
                    aVar2 = paVar9[-1];
                    pcVar6 = "\t\toperands[%u].type: IMM = 0x%x\n";
LAB_00143436:
                    printf(pcVar6,uVar7 & 0xffffffff,(ulong)aVar2);
                  }
                  else if (aVar1 == 1) {
                    pcVar6 = cs_reg_name(handle,paVar9[-1]);
                    printf("\t\toperands[%u].type: REG = %s\n",uVar7 & 0xffffffff,pcVar6);
                  }
                  uVar7 = uVar7 + 1;
                  paVar9 = paVar9 + 3;
                } while (uVar7 < (pcVar3->field_6).x86.rex);
              }
            }
            if ((pcVar3->field_6).arm64.cc != ARM64_CC_INVALID) {
              printf("\tCode condition: %u\n");
            }
            if ((pcVar3->field_6).arm.vector_size != 0) {
              printf("\tHint code: %u\n");
            }
            putchar(10);
          }
          sVar8 = sVar8 + 1;
        } while (sVar8 != count);
        printf("0x%lx:\n",(ulong)local_40[count - 1].size + local_40[count - 1].address);
        cs_free(local_40,count);
        uVar7 = (ulong)local_34;
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar5);
    }
    lVar10 = 1;
    uVar4 = uVar7 & 1;
    uVar7 = 0;
    if (uVar4 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}